

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Scaler * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Scaler>(Arena *arena)

{
  Scaler *this;
  
  if (arena == (Arena *)0x0) {
    this = (Scaler *)operator_new(0x38);
    CoreML::Specification::Scaler::Scaler(this,(Arena *)0x0,false);
  }
  else {
    this = (Scaler *)
           AllocateAlignedWithHook(arena,0x38,(type_info *)&CoreML::Specification::Scaler::typeinfo)
    ;
    CoreML::Specification::Scaler::Scaler(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }